

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::MarkDirty(PF_BufferMgr *this,int fd,PageNum pageNum)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  RC RVar3;
  int slot;
  int local_c;
  
  RVar3 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&local_c);
  if (RVar3 == -8) {
    RVar3 = 2;
  }
  else if (RVar3 == 0) {
    if (this->bufTable[local_c].pinCount == 0) {
      RVar3 = 7;
    }
    else {
      this->bufTable[local_c].bDirty = 1;
      Unlink(this,local_c);
      iVar1 = this->first;
      pPVar2 = this->bufTable;
      pPVar2[local_c].next = iVar1;
      pPVar2[local_c].prev = -1;
      if ((long)iVar1 != -1) {
        pPVar2[iVar1].prev = local_c;
      }
      this->first = local_c;
      RVar3 = 0;
      if (this->last == -1) {
        this->last = local_c;
      }
    }
  }
  return RVar3;
}

Assistant:

RC PF_BufferMgr::MarkDirty(int fd, PageNum pageNum)
{
   RC  rc;       // return code
   int slot;     // buffer slot where page is located

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Marking dirty (%d,%d).\n", fd, pageNum);
   WriteLog(psMessage);
#endif

   // The page must be found and pinned in the buffer
   if ((rc = hashTable.Find(fd, pageNum, slot))){
      if ((rc == PF_HASHNOTFOUND))
         return (PF_PAGENOTINBUF);
      else
         return (rc);              // unexpected error
   }

   if (bufTable[slot].pinCount == 0)
      return (PF_PAGEUNPINNED);

   // Mark this page dirty
   bufTable[slot].bDirty = TRUE;

   // Make this page the most recently used page
   if ((rc = Unlink(slot)) ||
         (rc = LinkHead (slot)))
      return (rc);

   // Return ok
   return (0);
}